

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall
SampleDiscrete_Basics_Test::~SampleDiscrete_Basics_Test(SampleDiscrete_Basics_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SampleDiscrete, Basics) {
    Float pdf;

    EXPECT_EQ(0, SampleDiscrete({Float(5)}, 0.251, &pdf));
    EXPECT_EQ(1, pdf);

    EXPECT_EQ(0, SampleDiscrete({Float(0.5), Float(0.5)}, 0., &pdf));
    EXPECT_EQ(0.5f, pdf);

    EXPECT_EQ(0, SampleDiscrete({Float(0.5), Float(0.5)}, 0.499, &pdf));
    EXPECT_EQ(0.5f, pdf);

    Float uRemapped;
    EXPECT_EQ(1, SampleDiscrete({Float(0.5), Float(0.5)}, 0.5f, &pdf, &uRemapped));
    EXPECT_EQ(0.5f, pdf);
    EXPECT_EQ(0, uRemapped);
}